

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  uint uVar11;
  longlong lVar12;
  longlong lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i *palVar22;
  __m128i *palVar23;
  char cVar24;
  char cVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *palVar29;
  int iVar30;
  byte bVar31;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  undefined1 auVar32 [16];
  byte bVar49;
  undefined1 auVar33 [16];
  ulong uVar42;
  __m128i vH_00;
  __m128i alVar50;
  int32_t in_stack_fffffffffffff8c8;
  ulong local_728;
  int local_71c;
  int local_70c;
  long local_708;
  long local_700;
  int local_6f8;
  ulong uStack_6e8;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m128i vCompare;
  int8_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_5bb;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  undefined1 local_4d8 [8];
  undefined1 local_4d0 [24];
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [24];
  undefined1 local_498 [8];
  undefined1 local_490 [24];
  undefined1 local_478 [8];
  undefined1 local_470 [360];
  char local_308;
  char cStack_307;
  char cStack_306;
  char cStack_305;
  char cStack_304;
  char cStack_303;
  char cStack_302;
  char cStack_301;
  char cStack_300;
  char cStack_2ff;
  char cStack_2fe;
  char cStack_2fd;
  char cStack_2fc;
  char cStack_2fb;
  char cStack_2fa;
  char cStack_2f9;
  char local_2f8;
  char cStack_2f7;
  char cStack_2f6;
  char cStack_2f5;
  char cStack_2f4;
  char cStack_2f3;
  char cStack_2f2;
  char cStack_2f1;
  char cStack_2f0;
  char cStack_2ef;
  char cStack_2ee;
  char cStack_2ed;
  char cStack_2ec;
  char cStack_2eb;
  char cStack_2ea;
  char cStack_2e9;
  char local_2e8;
  char cStack_2e7;
  char cStack_2e6;
  char cStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  char cStack_2e1;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  char cStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  char cStack_2d9;
  char local_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char local_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char local_278;
  char cStack_277;
  char cStack_276;
  char cStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  char cStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  char cStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  char cStack_269;
  char local_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char local_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char local_228;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse41_128_8",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar26 = (iVar1 + 0xf) / 0x10;
    iVar30 = (iVar1 + -1) % iVar26;
    iVar27 = ~((iVar1 + -1) / iVar26) + 0x10;
    pvVar4 = (profile->profile8).score;
    s1_beg_local._0_1_ = (char)open;
    local_4d0._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    local_4d8._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    uVar5 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,local_4d8._0_3_)))));
    uVar8 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,local_4d0._0_3_)))));
    i._0_1_ = (undefined1)gap;
    local_4b0._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    local_4b8._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    uVar6 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,local_4b8._0_3_)))));
    uVar9 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,local_4b0._0_3_)))));
    if (ppVar3->min <= -open) {
      s1_beg_local._0_1_ = -(char)ppVar3->min;
    }
    cVar24 = (char)s1_beg_local + -0x7f;
    cVar25 = ((byte)ppVar3->max ^ 0x7f) - 1;
    local_490._0_3_ = CONCAT21(CONCAT11(cVar24,cVar24),cVar24);
    local_498._0_3_ = CONCAT21(CONCAT11(cVar24,cVar24),cVar24);
    lVar7 = CONCAT17(cVar24,CONCAT16(cVar24,CONCAT15(cVar24,CONCAT14(cVar24,CONCAT13(cVar24,
                                                  local_498._0_3_)))));
    lVar10 = CONCAT17(cVar24,CONCAT16(cVar24,CONCAT15(cVar24,CONCAT14(cVar24,CONCAT13(cVar24,
                                                  local_490._0_3_)))));
    local_470._0_3_ = CONCAT21(CONCAT11(cVar25,cVar25),cVar25);
    local_478._0_3_ = CONCAT21(CONCAT11(cVar25,cVar25),cVar25);
    vSaturationCheckMax[1] =
         CONCAT17(cVar25,CONCAT16(cVar25,CONCAT15(cVar25,CONCAT14(cVar25,CONCAT13(cVar25,local_478.
                                                                                         _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar25,CONCAT16(cVar25,CONCAT15(cVar25,CONCAT14(cVar25,CONCAT13(cVar25,local_470.
                                                                                         _0_3_)))));
    vProfile._0_1_ = (char)iVar27;
    result._0_1_ = -((char)vProfile == '\x0f');
    result._1_1_ = -((char)vProfile == '\x0e');
    result._2_1_ = -((char)vProfile == '\r');
    result._3_1_ = -((char)vProfile == '\f');
    result._4_1_ = -((char)vProfile == '\v');
    result._5_1_ = -((char)vProfile == '\n');
    result._6_1_ = -((char)vProfile == '\t');
    result._7_1_ = -((char)vProfile == '\b');
    vPosMask[0]._0_1_ = -((char)vProfile == '\a');
    vPosMask[0]._1_1_ = -((char)vProfile == '\x06');
    vPosMask[0]._2_1_ = -((char)vProfile == '\x05');
    vPosMask[0]._3_1_ = -((char)vProfile == '\x04');
    vPosMask[0]._4_1_ = -((char)vProfile == '\x03');
    vPosMask[0]._5_1_ = -((char)vProfile == '\x02');
    vPosMask[0]._6_1_ = -((char)vProfile == '\x01');
    vPosMask[0]._7_1_ = -((char)vProfile == '\0');
    iVar28 = s1_beg;
    vPosMask[1] = lVar7;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar26 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100802;
      uVar11 = 0;
      if (s1_beg != 0) {
        uVar11 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar11 | *(uint *)&_segNum->field_0xc;
      uVar11 = 0;
      if (s1_end != 0) {
        uVar11 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar11 | *(uint *)&_segNum->field_0xc;
      uVar11 = 0;
      if (s2_beg != 0) {
        uVar11 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar11 | *(uint *)&_segNum->field_0xc;
      uVar11 = 0;
      if (s2_end != 0) {
        uVar11 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar11 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar26);
      pvE = parasail_memalign___m128i(0x10,(long)iVar26);
      ptr = parasail_memalign___m128i(0x10,(long)iVar26);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar26; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              local_6f8 = -(gap * (h.m[1]._0_4_ * iVar26 + k)) - open;
            }
            else {
              local_6f8 = 0;
            }
            local_708 = (long)local_6f8;
            local_700 = local_708;
            if (local_708 < -0x80) {
              local_700 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_700;
            local_708 = local_708 - open;
            if (local_708 < -0x80) {
              local_708 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_708;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_70c = -(gap * (k + -1)) - open;
          }
          else {
            local_70c = 0;
          }
          if (local_70c < -0x80) {
            local_70c = -0x80;
          }
          ptr_00[k] = (int8_t)local_70c;
        }
        vMaxH[0] = lVar10;
        vMaxH[1] = lVar7;
        vSaturationCheckMax[0] = lVar10;
        for (s1Len = 0; palVar23 = pvHLoad, palVar22 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar10;
          vH[1] = lVar7;
          palVar29 = pvHLoad + (iVar26 + -1);
          uVar42 = (*palVar29)[0];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar22;
          vH[0] = (*palVar29)[1] << 8 | uVar42 >> 0x38;
          vP = (__m128i *)(uVar42 << 8 | (ulong)(byte)ptr_00[s1Len]);
          for (k = 0; k < iVar26; k = k + 1) {
            auVar32 = paddsb((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar26) * 0x10));
            palVar29 = ptr + k;
            lVar12 = (*palVar29)[0];
            lVar13 = (*palVar29)[1];
            alVar50 = *palVar29;
            local_248 = auVar32[0];
            cStack_247 = auVar32[1];
            cStack_246 = auVar32[2];
            cStack_245 = auVar32[3];
            cStack_244 = auVar32[4];
            cStack_243 = auVar32[5];
            cStack_242 = auVar32[6];
            cStack_241 = auVar32[7];
            cStack_240 = auVar32[8];
            cStack_23f = auVar32[9];
            cStack_23e = auVar32[10];
            cStack_23d = auVar32[0xb];
            cStack_23c = auVar32[0xc];
            cStack_23b = auVar32[0xd];
            cStack_23a = auVar32[0xe];
            cStack_239 = auVar32[0xf];
            local_258 = (char)lVar12;
            cStack_257 = (char)((ulong)lVar12 >> 8);
            cStack_256 = (char)((ulong)lVar12 >> 0x10);
            cStack_255 = (char)((ulong)lVar12 >> 0x18);
            cStack_254 = (char)((ulong)lVar12 >> 0x20);
            cStack_253 = (char)((ulong)lVar12 >> 0x28);
            cStack_252 = (char)((ulong)lVar12 >> 0x30);
            cStack_251 = (char)((ulong)lVar12 >> 0x38);
            cStack_250 = (char)lVar13;
            cStack_24f = (char)((ulong)lVar13 >> 8);
            cStack_24e = (char)((ulong)lVar13 >> 0x10);
            cStack_24d = (char)((ulong)lVar13 >> 0x18);
            cStack_24c = (char)((ulong)lVar13 >> 0x20);
            cStack_24b = (char)((ulong)lVar13 >> 0x28);
            cStack_24a = (char)((ulong)lVar13 >> 0x30);
            cStack_249 = (char)((ulong)lVar13 >> 0x38);
            bVar31 = (local_248 < local_258) * local_258 | (local_248 >= local_258) * local_248;
            bVar34 = (cStack_247 < cStack_257) * cStack_257 |
                     (cStack_247 >= cStack_257) * cStack_247;
            bVar35 = (cStack_246 < cStack_256) * cStack_256 |
                     (cStack_246 >= cStack_256) * cStack_246;
            bVar36 = (cStack_245 < cStack_255) * cStack_255 |
                     (cStack_245 >= cStack_255) * cStack_245;
            bVar37 = (cStack_244 < cStack_254) * cStack_254 |
                     (cStack_244 >= cStack_254) * cStack_244;
            bVar38 = (cStack_243 < cStack_253) * cStack_253 |
                     (cStack_243 >= cStack_253) * cStack_243;
            bVar39 = (cStack_242 < cStack_252) * cStack_252 |
                     (cStack_242 >= cStack_252) * cStack_242;
            bVar40 = (cStack_241 < cStack_251) * cStack_251 |
                     (cStack_241 >= cStack_251) * cStack_241;
            bVar41 = (cStack_240 < cStack_250) * cStack_250 |
                     (cStack_240 >= cStack_250) * cStack_240;
            bVar43 = (cStack_23f < cStack_24f) * cStack_24f |
                     (cStack_23f >= cStack_24f) * cStack_23f;
            bVar44 = (cStack_23e < cStack_24e) * cStack_24e |
                     (cStack_23e >= cStack_24e) * cStack_23e;
            bVar45 = (cStack_23d < cStack_24d) * cStack_24d |
                     (cStack_23d >= cStack_24d) * cStack_23d;
            bVar46 = (cStack_23c < cStack_24c) * cStack_24c |
                     (cStack_23c >= cStack_24c) * cStack_23c;
            bVar47 = (cStack_23b < cStack_24b) * cStack_24b |
                     (cStack_23b >= cStack_24b) * cStack_23b;
            bVar48 = (cStack_23a < cStack_24a) * cStack_24a |
                     (cStack_23a >= cStack_24a) * cStack_23a;
            bVar49 = (cStack_239 < cStack_249) * cStack_249 |
                     (cStack_239 >= cStack_249) * cStack_239;
            local_278 = (char)vH[1];
            cStack_277 = vH[1]._1_1_;
            cStack_276 = vH[1]._2_1_;
            cStack_275 = vH[1]._3_1_;
            cStack_274 = vH[1]._4_1_;
            cStack_273 = vH[1]._5_1_;
            cStack_272 = vH[1]._6_1_;
            cStack_271 = vH[1]._7_1_;
            cStack_270 = (char)vH[2];
            cStack_26f = vH[2]._1_1_;
            cStack_26e = vH[2]._2_1_;
            cStack_26d = vH[2]._3_1_;
            cStack_26c = vH[2]._4_1_;
            cStack_26b = vH[2]._5_1_;
            cStack_26a = vH[2]._6_1_;
            cStack_269 = vH[2]._7_1_;
            bVar31 = ((char)bVar31 < local_278) * local_278 | ((char)bVar31 >= local_278) * bVar31;
            bVar34 = ((char)bVar34 < cStack_277) * cStack_277 |
                     ((char)bVar34 >= cStack_277) * bVar34;
            bVar35 = ((char)bVar35 < cStack_276) * cStack_276 |
                     ((char)bVar35 >= cStack_276) * bVar35;
            bVar36 = ((char)bVar36 < cStack_275) * cStack_275 |
                     ((char)bVar36 >= cStack_275) * bVar36;
            bVar37 = ((char)bVar37 < cStack_274) * cStack_274 |
                     ((char)bVar37 >= cStack_274) * bVar37;
            bVar38 = ((char)bVar38 < cStack_273) * cStack_273 |
                     ((char)bVar38 >= cStack_273) * bVar38;
            bVar39 = ((char)bVar39 < cStack_272) * cStack_272 |
                     ((char)bVar39 >= cStack_272) * bVar39;
            bVar40 = ((char)bVar40 < cStack_271) * cStack_271 |
                     ((char)bVar40 >= cStack_271) * bVar40;
            bVar41 = ((char)bVar41 < cStack_270) * cStack_270 |
                     ((char)bVar41 >= cStack_270) * bVar41;
            bVar43 = ((char)bVar43 < cStack_26f) * cStack_26f |
                     ((char)bVar43 >= cStack_26f) * bVar43;
            bVar44 = ((char)bVar44 < cStack_26e) * cStack_26e |
                     ((char)bVar44 >= cStack_26e) * bVar44;
            bVar45 = ((char)bVar45 < cStack_26d) * cStack_26d |
                     ((char)bVar45 >= cStack_26d) * bVar45;
            bVar46 = ((char)bVar46 < cStack_26c) * cStack_26c |
                     ((char)bVar46 >= cStack_26c) * bVar46;
            bVar47 = ((char)bVar47 < cStack_26b) * cStack_26b |
                     ((char)bVar47 >= cStack_26b) * bVar47;
            bVar48 = ((char)bVar48 < cStack_26a) * cStack_26a |
                     ((char)bVar48 >= cStack_26a) * bVar48;
            bVar49 = ((char)bVar49 < cStack_269) * cStack_269 |
                     ((char)bVar49 >= cStack_269) * bVar49;
            vP._0_2_ = CONCAT11(bVar34,bVar31);
            vP._0_3_ = CONCAT12(bVar35,vP._0_2_);
            vP._0_4_ = CONCAT13(bVar36,vP._0_3_);
            vP._0_5_ = CONCAT14(bVar37,vP._0_4_);
            vP._0_6_ = CONCAT15(bVar38,vP._0_5_);
            vP._0_7_ = CONCAT16(bVar39,vP._0_6_);
            vP = (__m128i *)CONCAT17(bVar40,vP._0_7_);
            vH[0]._0_1_ = bVar41;
            vH[0]._1_1_ = bVar43;
            vH[0]._2_1_ = bVar44;
            vH[0]._3_1_ = bVar45;
            vH[0]._4_1_ = bVar46;
            vH[0]._5_1_ = bVar47;
            vH[0]._6_1_ = bVar48;
            vH[0]._7_1_ = bVar49;
            palVar22[k][0] = (longlong)vP;
            palVar22[k][1] = vH[0];
            local_288 = (char)vMaxH[1];
            cStack_287 = (char)((ulong)vMaxH[1] >> 8);
            cStack_286 = (char)((ulong)vMaxH[1] >> 0x10);
            cStack_285 = (char)((ulong)vMaxH[1] >> 0x18);
            cStack_284 = (char)((ulong)vMaxH[1] >> 0x20);
            cStack_283 = (char)((ulong)vMaxH[1] >> 0x28);
            cStack_282 = (char)((ulong)vMaxH[1] >> 0x30);
            cStack_281 = (char)((ulong)vMaxH[1] >> 0x38);
            cStack_280 = (char)vSaturationCheckMax[0];
            cStack_27f = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_27e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_27d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_27c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_27b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_27a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_279 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            vMaxH[1]._0_2_ =
                 CONCAT11((cStack_287 < (char)bVar34) * bVar34 |
                          (cStack_287 >= (char)bVar34) * cStack_287,
                          (local_288 < (char)bVar31) * bVar31 |
                          (local_288 >= (char)bVar31) * local_288);
            vMaxH[1]._0_3_ =
                 CONCAT12((cStack_286 < (char)bVar35) * bVar35 |
                          (cStack_286 >= (char)bVar35) * cStack_286,(undefined2)vMaxH[1]);
            vMaxH[1]._0_4_ =
                 CONCAT13((cStack_285 < (char)bVar36) * bVar36 |
                          (cStack_285 >= (char)bVar36) * cStack_285,(undefined3)vMaxH[1]);
            vMaxH[1]._0_5_ =
                 CONCAT14((cStack_284 < (char)bVar37) * bVar37 |
                          (cStack_284 >= (char)bVar37) * cStack_284,(undefined4)vMaxH[1]);
            vMaxH[1]._0_6_ =
                 CONCAT15((cStack_283 < (char)bVar38) * bVar38 |
                          (cStack_283 >= (char)bVar38) * cStack_283,(undefined5)vMaxH[1]);
            vMaxH[1]._0_7_ =
                 CONCAT16((cStack_282 < (char)bVar39) * bVar39 |
                          (cStack_282 >= (char)bVar39) * cStack_282,(undefined6)vMaxH[1]);
            vMaxH[1] = CONCAT17((cStack_281 < (char)bVar40) * bVar40 |
                                (cStack_281 >= (char)bVar40) * cStack_281,(undefined7)vMaxH[1]);
            vSaturationCheckMax[0]._0_2_ =
                 CONCAT11((cStack_27f < (char)bVar43) * bVar43 |
                          (cStack_27f >= (char)bVar43) * cStack_27f,
                          (cStack_280 < (char)bVar41) * bVar41 |
                          (cStack_280 >= (char)bVar41) * cStack_280);
            vSaturationCheckMax[0]._0_3_ =
                 CONCAT12((cStack_27e < (char)bVar44) * bVar44 |
                          (cStack_27e >= (char)bVar44) * cStack_27e,
                          (undefined2)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT13((cStack_27d < (char)bVar45) * bVar45 |
                          (cStack_27d >= (char)bVar45) * cStack_27d,
                          (undefined3)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_5_ =
                 CONCAT14((cStack_27c < (char)bVar46) * bVar46 |
                          (cStack_27c >= (char)bVar46) * cStack_27c,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT15((cStack_27b < (char)bVar47) * bVar47 |
                          (cStack_27b >= (char)bVar47) * cStack_27b,
                          (undefined5)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_7_ =
                 CONCAT16((cStack_27a < (char)bVar48) * bVar48 |
                          (cStack_27a >= (char)bVar48) * cStack_27a,
                          (undefined6)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT17((cStack_279 < (char)bVar49) * bVar49 |
                          (cStack_279 >= (char)bVar49) * cStack_279,
                          (undefined7)vSaturationCheckMax[0]);
            local_1c8 = (char)vSaturationCheckMax[1];
            cStack_1c7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_1c6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_1c5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_1c4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_1c3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_1c2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_1c1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_1c0 = (char)vSaturationCheckMin[0];
            cStack_1bf = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_1be = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_1bd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_1bc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_1bb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_1ba = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_1b9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            bVar31 = ((char)bVar31 < local_1c8) * bVar31 | ((char)bVar31 >= local_1c8) * local_1c8;
            bVar34 = ((char)bVar34 < cStack_1c7) * bVar34 |
                     ((char)bVar34 >= cStack_1c7) * cStack_1c7;
            bVar35 = ((char)bVar35 < cStack_1c6) * bVar35 |
                     ((char)bVar35 >= cStack_1c6) * cStack_1c6;
            bVar36 = ((char)bVar36 < cStack_1c5) * bVar36 |
                     ((char)bVar36 >= cStack_1c5) * cStack_1c5;
            bVar37 = ((char)bVar37 < cStack_1c4) * bVar37 |
                     ((char)bVar37 >= cStack_1c4) * cStack_1c4;
            bVar38 = ((char)bVar38 < cStack_1c3) * bVar38 |
                     ((char)bVar38 >= cStack_1c3) * cStack_1c3;
            bVar39 = ((char)bVar39 < cStack_1c2) * bVar39 |
                     ((char)bVar39 >= cStack_1c2) * cStack_1c2;
            bVar40 = ((char)bVar40 < cStack_1c1) * bVar40 |
                     ((char)bVar40 >= cStack_1c1) * cStack_1c1;
            bVar41 = ((char)bVar41 < cStack_1c0) * bVar41 |
                     ((char)bVar41 >= cStack_1c0) * cStack_1c0;
            bVar43 = ((char)bVar43 < cStack_1bf) * bVar43 |
                     ((char)bVar43 >= cStack_1bf) * cStack_1bf;
            bVar44 = ((char)bVar44 < cStack_1be) * bVar44 |
                     ((char)bVar44 >= cStack_1be) * cStack_1be;
            bVar45 = ((char)bVar45 < cStack_1bd) * bVar45 |
                     ((char)bVar45 >= cStack_1bd) * cStack_1bd;
            bVar46 = ((char)bVar46 < cStack_1bc) * bVar46 |
                     ((char)bVar46 >= cStack_1bc) * cStack_1bc;
            bVar47 = ((char)bVar47 < cStack_1bb) * bVar47 |
                     ((char)bVar47 >= cStack_1bb) * cStack_1bb;
            bVar48 = ((char)bVar48 < cStack_1ba) * bVar48 |
                     ((char)bVar48 >= cStack_1ba) * cStack_1ba;
            bVar49 = ((char)bVar49 < cStack_1b9) * bVar49 |
                     ((char)bVar49 >= cStack_1b9) * cStack_1b9;
            bVar31 = (local_258 < (char)bVar31) * local_258 | (local_258 >= (char)bVar31) * bVar31;
            bVar34 = (cStack_257 < (char)bVar34) * cStack_257 |
                     (cStack_257 >= (char)bVar34) * bVar34;
            bVar35 = (cStack_256 < (char)bVar35) * cStack_256 |
                     (cStack_256 >= (char)bVar35) * bVar35;
            bVar36 = (cStack_255 < (char)bVar36) * cStack_255 |
                     (cStack_255 >= (char)bVar36) * bVar36;
            bVar37 = (cStack_254 < (char)bVar37) * cStack_254 |
                     (cStack_254 >= (char)bVar37) * bVar37;
            bVar38 = (cStack_253 < (char)bVar38) * cStack_253 |
                     (cStack_253 >= (char)bVar38) * bVar38;
            bVar39 = (cStack_252 < (char)bVar39) * cStack_252 |
                     (cStack_252 >= (char)bVar39) * bVar39;
            bVar40 = (cStack_251 < (char)bVar40) * cStack_251 |
                     (cStack_251 >= (char)bVar40) * bVar40;
            bVar41 = (cStack_250 < (char)bVar41) * cStack_250 |
                     (cStack_250 >= (char)bVar41) * bVar41;
            bVar43 = (cStack_24f < (char)bVar43) * cStack_24f |
                     (cStack_24f >= (char)bVar43) * bVar43;
            bVar44 = (cStack_24e < (char)bVar44) * cStack_24e |
                     (cStack_24e >= (char)bVar44) * bVar44;
            bVar45 = (cStack_24d < (char)bVar45) * cStack_24d |
                     (cStack_24d >= (char)bVar45) * bVar45;
            bVar46 = (cStack_24c < (char)bVar46) * cStack_24c |
                     (cStack_24c >= (char)bVar46) * bVar46;
            bVar47 = (cStack_24b < (char)bVar47) * cStack_24b |
                     (cStack_24b >= (char)bVar47) * bVar47;
            bVar48 = (cStack_24a < (char)bVar48) * cStack_24a |
                     (cStack_24a >= (char)bVar48) * bVar48;
            bVar49 = (cStack_249 < (char)bVar49) * cStack_249 |
                     (cStack_249 >= (char)bVar49) * bVar49;
            vSaturationCheckMax[1]._0_2_ =
                 CONCAT11((cStack_277 < (char)bVar34) * cStack_277 |
                          (cStack_277 >= (char)bVar34) * bVar34,
                          (local_278 < (char)bVar31) * local_278 |
                          (local_278 >= (char)bVar31) * bVar31);
            vSaturationCheckMax[1]._0_3_ =
                 CONCAT12((cStack_276 < (char)bVar35) * cStack_276 |
                          (cStack_276 >= (char)bVar35) * bVar35,(undefined2)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT13((cStack_275 < (char)bVar36) * cStack_275 |
                          (cStack_275 >= (char)bVar36) * bVar36,(undefined3)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_5_ =
                 CONCAT14((cStack_274 < (char)bVar37) * cStack_274 |
                          (cStack_274 >= (char)bVar37) * bVar37,(undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT15((cStack_273 < (char)bVar38) * cStack_273 |
                          (cStack_273 >= (char)bVar38) * bVar38,(undefined5)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_7_ =
                 CONCAT16((cStack_272 < (char)bVar39) * cStack_272 |
                          (cStack_272 >= (char)bVar39) * bVar39,(undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT17((cStack_271 < (char)bVar40) * cStack_271 |
                          (cStack_271 >= (char)bVar40) * bVar40,(undefined7)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_2_ =
                 CONCAT11((cStack_26f < (char)bVar43) * cStack_26f |
                          (cStack_26f >= (char)bVar43) * bVar43,
                          (cStack_270 < (char)bVar41) * cStack_270 |
                          (cStack_270 >= (char)bVar41) * bVar41);
            vSaturationCheckMin[0]._0_3_ =
                 CONCAT12((cStack_26e < (char)bVar44) * cStack_26e |
                          (cStack_26e >= (char)bVar44) * bVar44,(undefined2)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT13((cStack_26d < (char)bVar45) * cStack_26d |
                          (cStack_26d >= (char)bVar45) * bVar45,(undefined3)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_5_ =
                 CONCAT14((cStack_26c < (char)bVar46) * cStack_26c |
                          (cStack_26c >= (char)bVar46) * bVar46,(undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT15((cStack_26b < (char)bVar47) * cStack_26b |
                          (cStack_26b >= (char)bVar47) * bVar47,(undefined5)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_7_ =
                 CONCAT16((cStack_26a < (char)bVar48) * cStack_26a |
                          (cStack_26a >= (char)bVar48) * bVar48,(undefined6)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT17((cStack_269 < (char)bVar49) * cStack_269 |
                          (cStack_269 >= (char)bVar49) * bVar49,(undefined7)vSaturationCheckMin[0]);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar26;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,vH_00,s1Len,s2Len,iVar28,in_stack_fffffffffffff8c8);
            auVar18._8_8_ = vH[0];
            auVar18._0_8_ = vP;
            auVar17._8_8_ = uVar8;
            auVar17._0_8_ = uVar5;
            auVar32 = psubsb(auVar18,auVar17);
            auVar33._8_8_ = uVar9;
            auVar33._0_8_ = uVar6;
            auVar33 = psubsb((undefined1  [16])alVar50,auVar33);
            local_2a8 = auVar33[0];
            cStack_2a7 = auVar33[1];
            cStack_2a6 = auVar33[2];
            cStack_2a5 = auVar33[3];
            cStack_2a4 = auVar33[4];
            cStack_2a3 = auVar33[5];
            cStack_2a2 = auVar33[6];
            cStack_2a1 = auVar33[7];
            cStack_2a0 = auVar33[8];
            cStack_29f = auVar33[9];
            cStack_29e = auVar33[10];
            cStack_29d = auVar33[0xb];
            cStack_29c = auVar33[0xc];
            cStack_29b = auVar33[0xd];
            cStack_29a = auVar33[0xe];
            cStack_299 = auVar33[0xf];
            local_2b8 = auVar32[0];
            cStack_2b7 = auVar32[1];
            cStack_2b6 = auVar32[2];
            cStack_2b5 = auVar32[3];
            cStack_2b4 = auVar32[4];
            cStack_2b3 = auVar32[5];
            cStack_2b2 = auVar32[6];
            cStack_2b1 = auVar32[7];
            cStack_2b0 = auVar32[8];
            cStack_2af = auVar32[9];
            cStack_2ae = auVar32[10];
            cStack_2ad = auVar32[0xb];
            cStack_2ac = auVar32[0xc];
            cStack_2ab = auVar32[0xd];
            cStack_2aa = auVar32[0xe];
            cStack_2a9 = auVar32[0xf];
            vF[1] = CONCAT17((cStack_2a1 < cStack_2b1) * cStack_2b1 |
                             (cStack_2a1 >= cStack_2b1) * cStack_2a1,
                             CONCAT16((cStack_2a2 < cStack_2b2) * cStack_2b2 |
                                      (cStack_2a2 >= cStack_2b2) * cStack_2a2,
                                      CONCAT15((cStack_2a3 < cStack_2b3) * cStack_2b3 |
                                               (cStack_2a3 >= cStack_2b3) * cStack_2a3,
                                               CONCAT14((cStack_2a4 < cStack_2b4) * cStack_2b4 |
                                                        (cStack_2a4 >= cStack_2b4) * cStack_2a4,
                                                        CONCAT13((cStack_2a5 < cStack_2b5) *
                                                                 cStack_2b5 |
                                                                 (cStack_2a5 >= cStack_2b5) *
                                                                 cStack_2a5,
                                                                 CONCAT12((cStack_2a6 < cStack_2b6)
                                                                          * cStack_2b6 |
                                                                          (cStack_2a6 >= cStack_2b6)
                                                                          * cStack_2a6,
                                                                          CONCAT11((cStack_2a7 <
                                                                                   cStack_2b7) *
                                                                                   cStack_2b7 |
                                                                                   (cStack_2a7 >=
                                                                                   cStack_2b7) *
                                                                                   cStack_2a7,
                                                                                   (local_2a8 <
                                                                                   local_2b8) *
                                                                                   local_2b8 |
                                                                                   (local_2a8 >=
                                                                                   local_2b8) *
                                                                                   local_2a8)))))));
            vE[0]._0_1_ = (cStack_2a0 < cStack_2b0) * cStack_2b0 |
                          (cStack_2a0 >= cStack_2b0) * cStack_2a0;
            vE[0]._1_1_ = (cStack_29f < cStack_2af) * cStack_2af |
                          (cStack_29f >= cStack_2af) * cStack_29f;
            vE[0]._2_1_ = (cStack_29e < cStack_2ae) * cStack_2ae |
                          (cStack_29e >= cStack_2ae) * cStack_29e;
            vE[0]._3_1_ = (cStack_29d < cStack_2ad) * cStack_2ad |
                          (cStack_29d >= cStack_2ad) * cStack_29d;
            vE[0]._4_1_ = (cStack_29c < cStack_2ac) * cStack_2ac |
                          (cStack_29c >= cStack_2ac) * cStack_29c;
            vE[0]._5_1_ = (cStack_29b < cStack_2ab) * cStack_2ab |
                          (cStack_29b >= cStack_2ab) * cStack_29b;
            vE[0]._6_1_ = (cStack_29a < cStack_2aa) * cStack_2aa |
                          (cStack_29a >= cStack_2aa) * cStack_29a;
            vE[0]._7_1_ = (cStack_299 < cStack_2a9) * cStack_2a9 |
                          (cStack_299 >= cStack_2a9) * cStack_299;
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            auVar32._8_8_ = uVar9;
            auVar32._0_8_ = uVar6;
            auVar32 = psubsb(stack0xfffffffffffff978,auVar32);
            local_2c8 = auVar32[0];
            cStack_2c7 = auVar32[1];
            cStack_2c6 = auVar32[2];
            cStack_2c5 = auVar32[3];
            cStack_2c4 = auVar32[4];
            cStack_2c3 = auVar32[5];
            cStack_2c2 = auVar32[6];
            cStack_2c1 = auVar32[7];
            cStack_2c0 = auVar32[8];
            cStack_2bf = auVar32[9];
            cStack_2be = auVar32[10];
            cStack_2bd = auVar32[0xb];
            cStack_2bc = auVar32[0xc];
            cStack_2bb = auVar32[0xd];
            cStack_2ba = auVar32[0xe];
            cStack_2b9 = auVar32[0xf];
            vH[1] = CONCAT17((cStack_2c1 < cStack_2b1) * cStack_2b1 |
                             (cStack_2c1 >= cStack_2b1) * cStack_2c1,
                             CONCAT16((cStack_2c2 < cStack_2b2) * cStack_2b2 |
                                      (cStack_2c2 >= cStack_2b2) * cStack_2c2,
                                      CONCAT15((cStack_2c3 < cStack_2b3) * cStack_2b3 |
                                               (cStack_2c3 >= cStack_2b3) * cStack_2c3,
                                               CONCAT14((cStack_2c4 < cStack_2b4) * cStack_2b4 |
                                                        (cStack_2c4 >= cStack_2b4) * cStack_2c4,
                                                        CONCAT13((cStack_2c5 < cStack_2b5) *
                                                                 cStack_2b5 |
                                                                 (cStack_2c5 >= cStack_2b5) *
                                                                 cStack_2c5,
                                                                 CONCAT12((cStack_2c6 < cStack_2b6)
                                                                          * cStack_2b6 |
                                                                          (cStack_2c6 >= cStack_2b6)
                                                                          * cStack_2c6,
                                                                          CONCAT11((cStack_2c7 <
                                                                                   cStack_2b7) *
                                                                                   cStack_2b7 |
                                                                                   (cStack_2c7 >=
                                                                                   cStack_2b7) *
                                                                                   cStack_2c7,
                                                                                   (local_2c8 <
                                                                                   local_2b8) *
                                                                                   local_2b8 |
                                                                                   (local_2c8 >=
                                                                                   local_2b8) *
                                                                                   local_2c8)))))));
            vF[0]._0_1_ = (cStack_2c0 < cStack_2b0) * cStack_2b0 |
                          (cStack_2c0 >= cStack_2b0) * cStack_2c0;
            vF[0]._1_1_ = (cStack_2bf < cStack_2af) * cStack_2af |
                          (cStack_2bf >= cStack_2af) * cStack_2bf;
            vF[0]._2_1_ = (cStack_2be < cStack_2ae) * cStack_2ae |
                          (cStack_2be >= cStack_2ae) * cStack_2be;
            vF[0]._3_1_ = (cStack_2bd < cStack_2ad) * cStack_2ad |
                          (cStack_2bd >= cStack_2ad) * cStack_2bd;
            vF[0]._4_1_ = (cStack_2bc < cStack_2ac) * cStack_2ac |
                          (cStack_2bc >= cStack_2ac) * cStack_2bc;
            vF[0]._5_1_ = (cStack_2bb < cStack_2ab) * cStack_2ab |
                          (cStack_2bb >= cStack_2ab) * cStack_2bb;
            vF[0]._6_1_ = (cStack_2ba < cStack_2aa) * cStack_2aa |
                          (cStack_2ba >= cStack_2aa) * cStack_2ba;
            vF[0]._7_1_ = (cStack_2b9 < cStack_2a9) * cStack_2a9 |
                          (cStack_2b9 >= cStack_2a9) * cStack_2b9;
            _vP = palVar23[k];
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            if (s2_beg == 0) {
              local_71c = ptr_00[s1Len + 1] - open;
            }
            else {
              local_71c = -open;
            }
            local_728 = (ulong)local_71c;
            if ((long)local_728 < -0x80) {
              local_728 = 0xffffffffffffff80;
            }
            vF[0] = vF[0] << 8 | (ulong)vH[1] >> 0x38;
            vH[1] = vH[1] << 8 | local_728 & 0xff;
            for (k = 0; k < iVar26; k = k + 1) {
              lVar12 = palVar22[k][0];
              lVar13 = palVar22[k][1];
              local_2e8 = (char)lVar12;
              cStack_2e7 = (char)((ulong)lVar12 >> 8);
              cStack_2e6 = (char)((ulong)lVar12 >> 0x10);
              cStack_2e5 = (char)((ulong)lVar12 >> 0x18);
              cStack_2e4 = (char)((ulong)lVar12 >> 0x20);
              cStack_2e3 = (char)((ulong)lVar12 >> 0x28);
              cStack_2e2 = (char)((ulong)lVar12 >> 0x30);
              cStack_2e1 = (char)((ulong)lVar12 >> 0x38);
              cStack_2e0 = (char)lVar13;
              cStack_2df = (char)((ulong)lVar13 >> 8);
              cStack_2de = (char)((ulong)lVar13 >> 0x10);
              cStack_2dd = (char)((ulong)lVar13 >> 0x18);
              cStack_2dc = (char)((ulong)lVar13 >> 0x20);
              cStack_2db = (char)((ulong)lVar13 >> 0x28);
              cStack_2da = (char)((ulong)lVar13 >> 0x30);
              cStack_2d9 = (char)((ulong)lVar13 >> 0x38);
              local_2f8 = (char)vH[1];
              cStack_2f7 = vH[1]._1_1_;
              cStack_2f6 = vH[1]._2_1_;
              cStack_2f5 = vH[1]._3_1_;
              cStack_2f4 = vH[1]._4_1_;
              cStack_2f3 = vH[1]._5_1_;
              cStack_2f2 = vH[1]._6_1_;
              cStack_2f1 = vH[1]._7_1_;
              cStack_2f0 = (char)vH[2];
              cStack_2ef = vH[2]._1_1_;
              cStack_2ee = vH[2]._2_1_;
              cStack_2ed = vH[2]._3_1_;
              cStack_2ec = vH[2]._4_1_;
              cStack_2eb = vH[2]._5_1_;
              cStack_2ea = vH[2]._6_1_;
              cStack_2e9 = vH[2]._7_1_;
              bVar31 = (local_2e8 < local_2f8) * local_2f8 | (local_2e8 >= local_2f8) * local_2e8;
              bVar34 = (cStack_2e7 < cStack_2f7) * cStack_2f7 |
                       (cStack_2e7 >= cStack_2f7) * cStack_2e7;
              bVar35 = (cStack_2e6 < cStack_2f6) * cStack_2f6 |
                       (cStack_2e6 >= cStack_2f6) * cStack_2e6;
              bVar36 = (cStack_2e5 < cStack_2f5) * cStack_2f5 |
                       (cStack_2e5 >= cStack_2f5) * cStack_2e5;
              bVar37 = (cStack_2e4 < cStack_2f4) * cStack_2f4 |
                       (cStack_2e4 >= cStack_2f4) * cStack_2e4;
              bVar38 = (cStack_2e3 < cStack_2f3) * cStack_2f3 |
                       (cStack_2e3 >= cStack_2f3) * cStack_2e3;
              bVar39 = (cStack_2e2 < cStack_2f2) * cStack_2f2 |
                       (cStack_2e2 >= cStack_2f2) * cStack_2e2;
              bVar40 = (cStack_2e1 < cStack_2f1) * cStack_2f1 |
                       (cStack_2e1 >= cStack_2f1) * cStack_2e1;
              bVar41 = (cStack_2e0 < cStack_2f0) * cStack_2f0 |
                       (cStack_2e0 >= cStack_2f0) * cStack_2e0;
              bVar43 = (cStack_2df < cStack_2ef) * cStack_2ef |
                       (cStack_2df >= cStack_2ef) * cStack_2df;
              bVar44 = (cStack_2de < cStack_2ee) * cStack_2ee |
                       (cStack_2de >= cStack_2ee) * cStack_2de;
              bVar45 = (cStack_2dd < cStack_2ed) * cStack_2ed |
                       (cStack_2dd >= cStack_2ed) * cStack_2dd;
              bVar46 = (cStack_2dc < cStack_2ec) * cStack_2ec |
                       (cStack_2dc >= cStack_2ec) * cStack_2dc;
              bVar47 = (cStack_2db < cStack_2eb) * cStack_2eb |
                       (cStack_2db >= cStack_2eb) * cStack_2db;
              bVar48 = (cStack_2da < cStack_2ea) * cStack_2ea |
                       (cStack_2da >= cStack_2ea) * cStack_2da;
              bVar49 = (cStack_2d9 < cStack_2e9) * cStack_2e9 |
                       (cStack_2d9 >= cStack_2e9) * cStack_2d9;
              vP._0_2_ = CONCAT11(bVar34,bVar31);
              vP._0_3_ = CONCAT12(bVar35,vP._0_2_);
              vP._0_4_ = CONCAT13(bVar36,vP._0_3_);
              vP._0_5_ = CONCAT14(bVar37,vP._0_4_);
              vP._0_6_ = CONCAT15(bVar38,vP._0_5_);
              vP._0_7_ = CONCAT16(bVar39,vP._0_6_);
              vP = (__m128i *)CONCAT17(bVar40,vP._0_7_);
              vH[0]._0_1_ = bVar41;
              vH[0]._1_1_ = bVar43;
              vH[0]._2_1_ = bVar44;
              vH[0]._3_1_ = bVar45;
              vH[0]._4_1_ = bVar46;
              vH[0]._5_1_ = bVar47;
              vH[0]._6_1_ = bVar48;
              vH[0]._7_1_ = bVar49;
              palVar22[k][0] = (longlong)vP;
              palVar22[k][1] = vH[0];
              local_228 = (char)vSaturationCheckMax[1];
              cStack_227 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_226 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_225 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_224 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_223 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_222 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_221 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_220 = (char)vSaturationCheckMin[0];
              cStack_21f = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_21e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_21d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_21c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_21b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_21a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_219 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              vSaturationCheckMax[1]._0_2_ =
                   CONCAT11(((char)bVar34 < cStack_227) * bVar34 |
                            ((char)bVar34 >= cStack_227) * cStack_227,
                            ((char)bVar31 < local_228) * bVar31 |
                            ((char)bVar31 >= local_228) * local_228);
              vSaturationCheckMax[1]._0_3_ =
                   CONCAT12(((char)bVar35 < cStack_226) * bVar35 |
                            ((char)bVar35 >= cStack_226) * cStack_226,
                            (undefined2)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT13(((char)bVar36 < cStack_225) * bVar36 |
                            ((char)bVar36 >= cStack_225) * cStack_225,
                            (undefined3)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_5_ =
                   CONCAT14(((char)bVar37 < cStack_224) * bVar37 |
                            ((char)bVar37 >= cStack_224) * cStack_224,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT15(((char)bVar38 < cStack_223) * bVar38 |
                            ((char)bVar38 >= cStack_223) * cStack_223,
                            (undefined5)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_7_ =
                   CONCAT16(((char)bVar39 < cStack_222) * bVar39 |
                            ((char)bVar39 >= cStack_222) * cStack_222,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT17(((char)bVar40 < cStack_221) * bVar40 |
                            ((char)bVar40 >= cStack_221) * cStack_221,
                            (undefined7)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_2_ =
                   CONCAT11(((char)bVar43 < cStack_21f) * bVar43 |
                            ((char)bVar43 >= cStack_21f) * cStack_21f,
                            ((char)bVar41 < cStack_220) * bVar41 |
                            ((char)bVar41 >= cStack_220) * cStack_220);
              vSaturationCheckMin[0]._0_3_ =
                   CONCAT12(((char)bVar44 < cStack_21e) * bVar44 |
                            ((char)bVar44 >= cStack_21e) * cStack_21e,
                            (undefined2)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT13(((char)bVar45 < cStack_21d) * bVar45 |
                            ((char)bVar45 >= cStack_21d) * cStack_21d,
                            (undefined3)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_5_ =
                   CONCAT14(((char)bVar46 < cStack_21c) * bVar46 |
                            ((char)bVar46 >= cStack_21c) * cStack_21c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT15(((char)bVar47 < cStack_21b) * bVar47 |
                            ((char)bVar47 >= cStack_21b) * cStack_21b,
                            (undefined5)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_7_ =
                   CONCAT16(((char)bVar48 < cStack_21a) * bVar48 |
                            ((char)bVar48 >= cStack_21a) * cStack_21a,
                            (undefined6)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT17(((char)bVar49 < cStack_219) * bVar49 |
                            ((char)bVar49 >= cStack_219) * cStack_219,
                            (undefined7)vSaturationCheckMin[0]);
              local_308 = (char)vMaxH[1];
              cStack_307 = (char)((ulong)vMaxH[1] >> 8);
              cStack_306 = (char)((ulong)vMaxH[1] >> 0x10);
              cStack_305 = (char)((ulong)vMaxH[1] >> 0x18);
              cStack_304 = (char)((ulong)vMaxH[1] >> 0x20);
              cStack_303 = (char)((ulong)vMaxH[1] >> 0x28);
              cStack_302 = (char)((ulong)vMaxH[1] >> 0x30);
              cStack_301 = (char)((ulong)vMaxH[1] >> 0x38);
              cStack_300 = (char)vSaturationCheckMax[0];
              cStack_2ff = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_2fe = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_2fd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_2fc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_2fb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_2fa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_2f9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              vMaxH[1]._0_2_ =
                   CONCAT11((cStack_307 < (char)bVar34) * bVar34 |
                            (cStack_307 >= (char)bVar34) * cStack_307,
                            (local_308 < (char)bVar31) * bVar31 |
                            (local_308 >= (char)bVar31) * local_308);
              vMaxH[1]._0_3_ =
                   CONCAT12((cStack_306 < (char)bVar35) * bVar35 |
                            (cStack_306 >= (char)bVar35) * cStack_306,(undefined2)vMaxH[1]);
              vMaxH[1]._0_4_ =
                   CONCAT13((cStack_305 < (char)bVar36) * bVar36 |
                            (cStack_305 >= (char)bVar36) * cStack_305,(undefined3)vMaxH[1]);
              vMaxH[1]._0_5_ =
                   CONCAT14((cStack_304 < (char)bVar37) * bVar37 |
                            (cStack_304 >= (char)bVar37) * cStack_304,(undefined4)vMaxH[1]);
              vMaxH[1]._0_6_ =
                   CONCAT15((cStack_303 < (char)bVar38) * bVar38 |
                            (cStack_303 >= (char)bVar38) * cStack_303,(undefined5)vMaxH[1]);
              vMaxH[1]._0_7_ =
                   CONCAT16((cStack_302 < (char)bVar39) * bVar39 |
                            (cStack_302 >= (char)bVar39) * cStack_302,(undefined6)vMaxH[1]);
              vMaxH[1] = CONCAT17((cStack_301 < (char)bVar40) * bVar40 |
                                  (cStack_301 >= (char)bVar40) * cStack_301,(undefined7)vMaxH[1]);
              vSaturationCheckMax[0]._0_2_ =
                   CONCAT11((cStack_2ff < (char)bVar43) * bVar43 |
                            (cStack_2ff >= (char)bVar43) * cStack_2ff,
                            (cStack_300 < (char)bVar41) * bVar41 |
                            (cStack_300 >= (char)bVar41) * cStack_300);
              vSaturationCheckMax[0]._0_3_ =
                   CONCAT12((cStack_2fe < (char)bVar44) * bVar44 |
                            (cStack_2fe >= (char)bVar44) * cStack_2fe,
                            (undefined2)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT13((cStack_2fd < (char)bVar45) * bVar45 |
                            (cStack_2fd >= (char)bVar45) * cStack_2fd,
                            (undefined3)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_5_ =
                   CONCAT14((cStack_2fc < (char)bVar46) * bVar46 |
                            (cStack_2fc >= (char)bVar46) * cStack_2fc,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT15((cStack_2fb < (char)bVar47) * bVar47 |
                            (cStack_2fb >= (char)bVar47) * cStack_2fb,
                            (undefined5)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_7_ =
                   CONCAT16((cStack_2fa < (char)bVar48) * bVar48 |
                            (cStack_2fa >= (char)bVar48) * cStack_2fa,
                            (undefined6)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT17((cStack_2f9 < (char)bVar49) * bVar49 |
                            (cStack_2f9 >= (char)bVar49) * cStack_2f9,
                            (undefined7)vSaturationCheckMax[0]);
              alVar50[0] = (ulong)(uint)k;
              alVar50[1]._0_4_ = iVar26;
              alVar50[1]._4_4_ = 0;
              arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                              rowcols->score_row,alVar50,s1Len,s2Len,iVar28,
                              in_stack_fffffffffffff8c8);
              auVar16._8_8_ = vH[0];
              auVar16._0_8_ = vP;
              auVar15._8_8_ = uVar8;
              auVar15._0_8_ = uVar5;
              auVar32 = psubsb(auVar16,auVar15);
              auVar14._8_8_ = uVar9;
              auVar14._0_8_ = uVar6;
              register0x00001200 = psubsb(stack0xfffffffffffff978,auVar14);
              local_98 = (char)vH[1];
              cStack_97 = vH[1]._1_1_;
              cStack_96 = vH[1]._2_1_;
              cStack_95 = vH[1]._3_1_;
              cStack_94 = vH[1]._4_1_;
              cStack_93 = vH[1]._5_1_;
              cStack_92 = vH[1]._6_1_;
              cStack_91 = vH[1]._7_1_;
              cStack_90 = (char)vH[2];
              cStack_8f = vH[2]._1_1_;
              cStack_8e = vH[2]._2_1_;
              cStack_8d = vH[2]._3_1_;
              cStack_8c = vH[2]._4_1_;
              cStack_8b = vH[2]._5_1_;
              cStack_8a = vH[2]._6_1_;
              cStack_89 = vH[2]._7_1_;
              local_a8 = auVar32[0];
              cStack_a7 = auVar32[1];
              cStack_a6 = auVar32[2];
              cStack_a5 = auVar32[3];
              cStack_a4 = auVar32[4];
              cStack_a3 = auVar32[5];
              cStack_a2 = auVar32[6];
              cStack_a1 = auVar32[7];
              cStack_a0 = auVar32[8];
              cStack_9f = auVar32[9];
              cStack_9e = auVar32[10];
              cStack_9d = auVar32[0xb];
              cStack_9c = auVar32[0xc];
              cStack_9b = auVar32[0xd];
              cStack_9a = auVar32[0xe];
              cStack_99 = auVar32[0xf];
              auVar21[1] = -(cStack_a7 < cStack_97);
              auVar21[0] = -(local_a8 < local_98);
              auVar21[2] = -(cStack_a6 < cStack_96);
              auVar21[3] = -(cStack_a5 < cStack_95);
              auVar21[4] = -(cStack_a4 < cStack_94);
              auVar21[5] = -(cStack_a3 < cStack_93);
              auVar21[6] = -(cStack_a2 < cStack_92);
              auVar21[7] = -(cStack_a1 < cStack_91);
              auVar21[8] = -(cStack_a0 < cStack_90);
              auVar21[9] = -(cStack_9f < cStack_8f);
              auVar21[10] = -(cStack_9e < cStack_8e);
              auVar21[0xb] = -(cStack_9d < cStack_8d);
              auVar21[0xc] = -(cStack_9c < cStack_8c);
              auVar21[0xd] = -(cStack_9b < cStack_8b);
              auVar21[0xe] = -(cStack_9a < cStack_8a);
              auVar21[0xf] = -(cStack_99 < cStack_89);
              if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar21 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  cStack_99 >= cStack_89) goto LAB_0099eb60;
            }
          }
LAB_0099eb60:
          lVar12 = palVar22[iVar30][0];
          lVar13 = palVar22[iVar30][1];
          local_b8 = (char)lVar12;
          cStack_b7 = (char)((ulong)lVar12 >> 8);
          cStack_b6 = (char)((ulong)lVar12 >> 0x10);
          cStack_b5 = (char)((ulong)lVar12 >> 0x18);
          cStack_b4 = (char)((ulong)lVar12 >> 0x20);
          cStack_b3 = (char)((ulong)lVar12 >> 0x28);
          cStack_b2 = (char)((ulong)lVar12 >> 0x30);
          cStack_b1 = (char)((ulong)lVar12 >> 0x38);
          cStack_b0 = (char)lVar13;
          cStack_af = (char)((ulong)lVar13 >> 8);
          cStack_ae = (char)((ulong)lVar13 >> 0x10);
          cStack_ad = (char)((ulong)lVar13 >> 0x18);
          cStack_ac = (char)((ulong)lVar13 >> 0x20);
          cStack_ab = (char)((ulong)lVar13 >> 0x28);
          cStack_aa = (char)((ulong)lVar13 >> 0x30);
          cStack_a9 = (char)((ulong)lVar13 >> 0x38);
          local_c8 = (char)vPosMask[1];
          cStack_c7 = (char)((ulong)vPosMask[1] >> 8);
          cStack_c6 = (char)((ulong)vPosMask[1] >> 0x10);
          cStack_c5 = (char)((ulong)vPosMask[1] >> 0x18);
          cStack_c4 = (char)((ulong)vPosMask[1] >> 0x20);
          cStack_c3 = (char)((ulong)vPosMask[1] >> 0x28);
          cStack_c2 = (char)((ulong)vPosMask[1] >> 0x30);
          cStack_c1 = (char)((ulong)vPosMask[1] >> 0x38);
          cStack_c0 = (char)vMaxH[0];
          cStack_bf = (char)((ulong)vMaxH[0] >> 8);
          cStack_be = (char)((ulong)vMaxH[0] >> 0x10);
          cStack_bd = (char)((ulong)vMaxH[0] >> 0x18);
          cStack_bc = (char)((ulong)vMaxH[0] >> 0x20);
          cStack_bb = (char)((ulong)vMaxH[0] >> 0x28);
          cStack_ba = (char)((ulong)vMaxH[0] >> 0x30);
          cStack_b9 = (char)((ulong)vMaxH[0] >> 0x38);
          uVar42 = CONCAT17(vPosMask[0]._7_1_,
                            CONCAT16(vPosMask[0]._6_1_,
                                     CONCAT15(vPosMask[0]._5_1_,
                                              CONCAT14(vPosMask[0]._4_1_,
                                                       CONCAT13(vPosMask[0]._3_1_,
                                                                CONCAT12(vPosMask[0]._2_1_,
                                                                         CONCAT11(vPosMask[0]._1_1_,
                                                                                  (char)vPosMask[0])
                                                                        )))))) &
                   CONCAT17(-(cStack_b9 < cStack_a9),
                            CONCAT16(-(cStack_ba < cStack_aa),
                                     CONCAT15(-(cStack_bb < cStack_ab),
                                              CONCAT14(-(cStack_bc < cStack_ac),
                                                       CONCAT13(-(cStack_bd < cStack_ad),
                                                                CONCAT12(-(cStack_be < cStack_ae),
                                                                         CONCAT11(-(cStack_bf <
                                                                                   cStack_af),
                                                                                  -(cStack_c0 <
                                                                                   cStack_b0))))))))
          ;
          vPosMask[1] = CONCAT17((cStack_b1 < cStack_c1) * cStack_c1 |
                                 (cStack_b1 >= cStack_c1) * cStack_b1,
                                 CONCAT16((cStack_b2 < cStack_c2) * cStack_c2 |
                                          (cStack_b2 >= cStack_c2) * cStack_b2,
                                          CONCAT15((cStack_b3 < cStack_c3) * cStack_c3 |
                                                   (cStack_b3 >= cStack_c3) * cStack_b3,
                                                   CONCAT14((cStack_b4 < cStack_c4) * cStack_c4 |
                                                            (cStack_b4 >= cStack_c4) * cStack_b4,
                                                            CONCAT13((cStack_b5 < cStack_c5) *
                                                                     cStack_c5 |
                                                                     (cStack_b5 >= cStack_c5) *
                                                                     cStack_b5,
                                                                     CONCAT12((cStack_b6 < cStack_c6
                                                                              ) * cStack_c6 |
                                                                              (cStack_b6 >=
                                                                              cStack_c6) * cStack_b6
                                                                              ,CONCAT11((cStack_b7 <
                                                                                        cStack_c7) *
                                                                                        cStack_c7 |
                                                                                        (cStack_b7
                                                                                        >= cStack_c7
                                                                                        ) * 
                                                  cStack_b7,
                                                  (local_b8 < local_c8) * local_c8 |
                                                  (local_b8 >= local_c8) * local_b8)))))));
          vMaxH[0] = CONCAT17((cStack_a9 < cStack_b9) * cStack_b9 |
                              (cStack_a9 >= cStack_b9) * cStack_a9,
                              CONCAT16((cStack_aa < cStack_ba) * cStack_ba |
                                       (cStack_aa >= cStack_ba) * cStack_aa,
                                       CONCAT15((cStack_ab < cStack_bb) * cStack_bb |
                                                (cStack_ab >= cStack_bb) * cStack_ab,
                                                CONCAT14((cStack_ac < cStack_bc) * cStack_bc |
                                                         (cStack_ac >= cStack_bc) * cStack_ac,
                                                         CONCAT13((cStack_ad < cStack_bd) *
                                                                  cStack_bd |
                                                                  (cStack_ad >= cStack_bd) *
                                                                  cStack_ad,
                                                                  CONCAT12((cStack_ae < cStack_be) *
                                                                           cStack_be |
                                                                           (cStack_ae >= cStack_be)
                                                                           * cStack_ae,
                                                                           CONCAT11((cStack_af <
                                                                                    cStack_bf) *
                                                                                    cStack_bf |
                                                                                    (cStack_af >=
                                                                                    cStack_bf) *
                                                                                    cStack_af,
                                                                                    (cStack_b0 <
                                                                                    cStack_c0) *
                                                                                    cStack_c0 |
                                                                                    (cStack_b0 >=
                                                                                    cStack_c0) *
                                                                                    cStack_b0)))))))
          ;
          auVar20._8_8_ = uVar42;
          auVar20._0_8_ =
               CONCAT17(result._7_1_,
                        CONCAT16(result._6_1_,
                                 CONCAT15(result._5_1_,
                                          CONCAT14(result._4_1_,
                                                   CONCAT13(result._3_1_,
                                                            CONCAT12(result._2_1_,
                                                                     CONCAT11(result._1_1_,
                                                                              (char)result))))))) &
               CONCAT17(-(cStack_c1 < cStack_b1),
                        CONCAT16(-(cStack_c2 < cStack_b2),
                                 CONCAT15(-(cStack_c3 < cStack_b3),
                                          CONCAT14(-(cStack_c4 < cStack_b4),
                                                   CONCAT13(-(cStack_c5 < cStack_b5),
                                                            CONCAT12(-(cStack_c6 < cStack_b6),
                                                                     CONCAT11(-(cStack_c7 <
                                                                               cStack_b7),
                                                                              -(local_c8 < local_b8)
                                                                             )))))));
          if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar42 >> 7 & 1) != 0) || (uVar42 >> 0xf & 1) != 0) ||
                  (uVar42 >> 0x17 & 1) != 0) || (uVar42 >> 0x1f & 1) != 0) ||
                (uVar42 >> 0x27 & 1) != 0) || (uVar42 >> 0x2f & 1) != 0) ||
              (uVar42 >> 0x37 & 1) != 0) || (long)uVar42 < 0) {
            matrix._0_4_ = s1Len;
          }
        }
        local_5bb = cVar24;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar27; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 8 | (ulong)vPosMask[1] >> 0x38;
            vPosMask[1] = vPosMask[1] << 8;
          }
          local_5bb = vMaxH[0]._7_1_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = pvHLoad;
          for (k = 0; k < iVar26 * 0x10; k = k + 1) {
            iVar28 = k / 0x10 + (k % 0x10) * iVar26;
            if (iVar28 < iVar1) {
              if (local_5bb < (char)(*_temp)[0]) {
                local_5bb = (char)(*_temp)[0];
                matrix._0_4_ = s2Len + -1;
                matrix._4_4_ = iVar28;
              }
              else if ((((char)(*_temp)[0] == local_5bb) && ((int)matrix == s2Len + -1)) &&
                      (iVar28 < matrix._4_4_)) {
                matrix._4_4_ = iVar28;
              }
            }
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = pvHLoad[iVar30][1];
          uStack_6e8 = pvHLoad[iVar30][0];
          for (end_query = 0; end_query < iVar27; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 8 | uStack_6e8 >> 0x38;
            uStack_6e8 = uStack_6e8 << 8;
          }
          local_5bb = vH_1[0]._7_1_;
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
        }
        local_28 = (char)vSaturationCheckMax[1];
        cStack_27 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_26 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_25 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_24 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_23 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_22 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_21 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_20 = (char)vSaturationCheckMin[0];
        cStack_1f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_19 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_d8 = (char)vMaxH[1];
        cStack_d7 = (char)((ulong)vMaxH[1] >> 8);
        cStack_d6 = (char)((ulong)vMaxH[1] >> 0x10);
        cStack_d5 = (char)((ulong)vMaxH[1] >> 0x18);
        cStack_d4 = (char)((ulong)vMaxH[1] >> 0x20);
        cStack_d3 = (char)((ulong)vMaxH[1] >> 0x28);
        cStack_d2 = (char)((ulong)vMaxH[1] >> 0x30);
        cStack_d1 = (char)((ulong)vMaxH[1] >> 0x38);
        cStack_d0 = (char)vSaturationCheckMax[0];
        cStack_cf = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_ce = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_cd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_cc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_cb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_ca = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_c9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar42 = CONCAT17(-(cStack_19 < cVar24),
                          CONCAT16(-(cStack_1a < cVar24),
                                   CONCAT15(-(cStack_1b < cVar24),
                                            CONCAT14(-(cStack_1c < cVar24),
                                                     CONCAT13(-(cStack_1d < cVar24),
                                                              CONCAT12(-(cStack_1e < cVar24),
                                                                       CONCAT11(-(cStack_1f < cVar24
                                                                                 ),-(cStack_20 <
                                                                                    cVar24)))))))) |
                 CONCAT17(-(cVar25 < cStack_c9),
                          CONCAT16(-(cVar25 < cStack_ca),
                                   CONCAT15(-(cVar25 < cStack_cb),
                                            CONCAT14(-(cVar25 < cStack_cc),
                                                     CONCAT13(-(cVar25 < cStack_cd),
                                                              CONCAT12(-(cVar25 < cStack_ce),
                                                                       CONCAT11(-(cVar25 < cStack_cf
                                                                                 ),-(cVar25 < 
                                                  cStack_d0))))))));
        auVar19._8_8_ = uVar42;
        auVar19._0_8_ =
             CONCAT17(-(cStack_21 < cVar24),
                      CONCAT16(-(cStack_22 < cVar24),
                               CONCAT15(-(cStack_23 < cVar24),
                                        CONCAT14(-(cStack_24 < cVar24),
                                                 CONCAT13(-(cStack_25 < cVar24),
                                                          CONCAT12(-(cStack_26 < cVar24),
                                                                   CONCAT11(-(cStack_27 < cVar24),
                                                                            -(local_28 < cVar24)))))
                                       ))) |
             CONCAT17(-(cVar25 < cStack_d1),
                      CONCAT16(-(cVar25 < cStack_d2),
                               CONCAT15(-(cVar25 < cStack_d3),
                                        CONCAT14(-(cVar25 < cStack_d4),
                                                 CONCAT13(-(cVar25 < cStack_d5),
                                                          CONCAT12(-(cVar25 < cStack_d6),
                                                                   CONCAT11(-(cVar25 < cStack_d7),
                                                                            -(cVar25 < local_d8)))))
                                       )));
        if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar42 >> 7 & 1) != 0) || (uVar42 >> 0xf & 1) != 0) || (uVar42 >> 0x17 & 1) != 0)
               || (uVar42 >> 0x1f & 1) != 0) || (uVar42 >> 0x27 & 1) != 0) ||
             (uVar42 >> 0x2f & 1) != 0) || (uVar42 >> 0x37 & 1) != 0) || (long)uVar42 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_5bb = '\0';
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_5bb;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8 (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}